

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeMassMatrixAndGravityForce(ChElementBeamANCF_3243 *this)

{
  double zeta;
  double dVar1;
  double dVar2;
  double eta;
  double dVar3;
  double xi;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar20;
  VectorN Sxi_compact;
  type tmp;
  ChMatrixNM<double,_NSF,_NSF>_conflict MassMatrixCompactSquare;
  ulong local_760;
  ulong local_758;
  double local_750;
  plain_array<double,_8,_0,_64> local_700;
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  double local_4c0;
  plain_array<double,_8,_0,_64> *ppStack_4b8;
  undefined1 auStack_4b0 [48];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  local_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  local_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  local_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  local_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  local_280 = 0;
  uStack_278 = 0;
  uStack_270 = 0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  uStack_248 = 0;
  local_2c0 = 0;
  uStack_2b8 = 0;
  uStack_2b0 = 0;
  uStack_2a8 = 0;
  uStack_2a0 = 0;
  uStack_298 = 0;
  uStack_290 = 0;
  uStack_288 = 0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  peVar7 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_750 = peVar7->m_rho;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_750 = peVar7->m_rho;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(DAT_00b6ab58 + 0x80) != *(long *)(DAT_00b6ab58 + 0x78)) {
    local_760 = 0;
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpaddq_avx512f(auVar16,_DAT_009a3b40);
    auVar18 = vpaddq_avx512f(auVar16,_DAT_009a3b80);
    auVar19 = vpaddq_avx512f(auVar16,_DAT_009a3b00);
    local_540 = vmovdqa64_avx512f(auVar17);
    local_580 = vmovdqa64_avx512f(auVar18);
    auVar17 = vpaddq_avx512f(auVar16,_DAT_009a3bc0);
    auVar18 = vpaddq_avx512f(auVar16,_DAT_009a3c00);
    local_500 = vmovdqa64_avx512f(auVar19);
    local_5c0 = vmovdqa64_avx512f(auVar17);
    local_600 = vmovdqa64_avx512f(auVar18);
    auVar17 = vpaddq_avx512f(auVar16,_DAT_009a3c40);
    auVar18 = vpaddq_avx512f(auVar16,_DAT_009a3c80);
    auVar16 = vpaddq_avx512f(auVar16,_DAT_009a3cc0);
    local_640 = vmovdqa64_avx512f(auVar17);
    local_680 = vmovdqa64_avx512f(auVar18);
    local_6c0 = vmovdqa64_avx512f(auVar16);
    lVar9 = DAT_00b6ab58;
    do {
      puVar10 = *(undefined8 **)(lVar9 + 0x18);
      puVar11 = *(undefined8 **)(lVar9 + 0x20);
      if (puVar11 != puVar10) {
        local_758 = 0;
        do {
          if (puVar11 == puVar10) break;
          uVar14 = 0;
          do {
            zeta = (double)puVar10[uVar14];
            dVar1 = *(double *)(*(long *)(static_tables_3243 + 0x78) + local_760 * 8);
            dVar2 = *(double *)(*(long *)(static_tables_3243 + 0x18) + local_758 * 8);
            eta = (double)puVar10[local_758];
            dVar3 = *(double *)(*(long *)(static_tables_3243 + 0x18) + uVar14 * 8);
            xi = *(double *)(*(long *)(lVar9 + 0x78) + local_760 * 8);
            dVar20 = Calc_det_J_0xi(this,xi,eta,zeta);
            Calc_Sxi_compact(this,(VectorN *)&local_700,xi,eta,zeta);
            lVar9 = 0;
            local_4c0 = dVar20 * dVar1 * dVar2 * dVar3 * local_750;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_4c0;
            auVar16 = vbroadcastsd_avx512f(auVar5);
            auVar16 = vmulpd_avx512f(auVar16,(undefined1  [64])local_700.array);
            auVar16 = vaddpd_avx512f(auVar16,*(undefined1 (*) [64])
                                              (this->m_GravForceScale).
                                              super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
                                              .m_storage.m_data.array);
            *(undefined1 (*) [64])
             (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.
             m_storage.m_data.array = auVar16;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_4c0;
            auVar16 = vbroadcastsd_avx512f(auVar6);
            auVar16 = vmulpd_avx512f(auVar16,(undefined1  [64])local_700.array);
            ppStack_4b8 = &local_700;
            do {
              uVar4 = *(undefined8 *)((long)local_700.array + lVar9);
              auVar17._8_8_ = uVar4;
              auVar17._0_8_ = uVar4;
              auVar17._16_8_ = uVar4;
              auVar17._24_8_ = uVar4;
              auVar17._32_8_ = uVar4;
              auVar17._40_8_ = uVar4;
              auVar17._48_8_ = uVar4;
              auVar17._56_8_ = uVar4;
              auVar17 = vmulpd_avx512f(auVar16,auVar17);
              *(undefined1 (*) [64])(&local_4c0 + lVar9) = auVar17;
              lVar9 = lVar9 + 8;
            } while (lVar9 != 0x40);
            uVar14 = (ulong)((int)uVar14 + 1);
            auVar17 = vgatherqpd_avx512f(*puVar10);
            auVar16._8_8_ = ppStack_4b8;
            auVar16._0_8_ = local_4c0;
            auVar16._16_48_ = auStack_4b0;
            auVar16 = vaddpd_avx512f(auVar17,auVar16);
            vscatterqpd_avx512f(ZEXT864(0) + local_500,0xffff,auVar16);
            auVar16 = vgatherqpd_avx512f(*puVar10);
            auVar16 = vaddpd_avx512f(auVar16,local_480);
            vscatterqpd_avx512f(ZEXT864(0) + local_540,0xffff,auVar16);
            auVar16 = vgatherqpd_avx512f(*puVar10);
            auVar16 = vaddpd_avx512f(auVar16,local_440);
            vscatterqpd_avx512f(ZEXT864(0) + local_580,0xffff,auVar16);
            auVar16 = vgatherqpd_avx512f(*puVar10);
            auVar16 = vaddpd_avx512f(auVar16,local_400);
            vscatterqpd_avx512f(ZEXT864(0) + local_5c0,0xffff,auVar16);
            auVar16 = vgatherqpd_avx512f(*puVar10);
            auVar16 = vaddpd_avx512f(auVar16,local_3c0);
            vscatterqpd_avx512f(ZEXT864(0) + local_600,0xffff,auVar16);
            auVar16 = vgatherqpd_avx512f(*puVar10);
            auVar16 = vaddpd_avx512f(auVar16,local_380);
            vscatterqpd_avx512f(ZEXT864(0) + local_640,0xffff,auVar16);
            auVar16 = vgatherqpd_avx512f(*puVar10);
            auVar16 = vaddpd_avx512f(auVar16,local_340);
            vscatterqpd_avx512f(ZEXT864(0) + local_680,0xffff,auVar16);
            auVar16 = vgatherqpd_avx512f(*puVar10);
            auVar16 = vaddpd_avx512f(auVar16,local_300);
            vscatterqpd_avx512f(ZEXT864(0) + local_6c0,0xffff,auVar16);
            puVar11 = *(undefined8 **)(DAT_00b6ab58 + 0x20);
            puVar10 = *(undefined8 **)(DAT_00b6ab58 + 0x18);
            uVar13 = (long)puVar11 - (long)puVar10 >> 3;
            lVar9 = DAT_00b6ab58;
          } while (uVar14 < uVar13);
          local_758 = (ulong)((int)local_758 + 1);
        } while (local_758 < uVar13);
      }
      local_760 = (ulong)((int)local_760 + 1);
    } while (local_760 < (ulong)(*(long *)(lVar9 + 0x80) - *(long *)(lVar9 + 0x78) >> 3));
  }
  iVar8 = 8;
  puVar11 = &local_2c0;
  uVar12 = 0;
  uVar14 = 0;
  do {
    uVar13 = (ulong)uVar12;
    lVar9 = 0x24 - uVar13;
    if (0x24 < uVar13) {
      lVar9 = 0;
    }
    lVar15 = 0;
    do {
      if (7 < (uVar14 + lVar15 | uVar14)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 8, 8, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 8, 8, 1>, Level = 1]"
                     );
      }
      if (lVar9 == lVar15) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 36, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 36, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.m_storage.
      m_data.array[uVar13 + lVar15] = (double)puVar11[lVar15];
      lVar15 = lVar15 + 1;
    } while ((int)lVar15 + (int)uVar14 != 8);
    uVar12 = uVar12 + iVar8;
    uVar14 = uVar14 + 1;
    iVar8 = iVar8 + -1;
    puVar11 = puVar11 + 9;
    if (uVar14 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void ChElementBeamANCF_3243::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 10 in xi, 3 in eta, and 3 in zeta.
    // 4 GQ Points are needed in the xi direction and 2 GQ Points are needed in the eta and zeta directions for
    // exact integration of the element's mass matrix, even if the reference configuration is not straight. Since the
    // major pieces of the generalized force due to gravity can also be used to calculate the mass matrix, these
    // calculations are performed at the same time.  Only the matrix that scales the acceleration due to gravity is
    // calculated at this time so that any changes to the acceleration due to gravity in the system are correctly
    // accounted for in the generalized internal force calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = 5;        // 6 Point Gauss-Quadrature;
    unsigned int GQ_idx_eta_zeta = 1;  // 2 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}